

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O1

double time_cc<std::shuffle_order_engine<std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>,256ul>>
                 (shuffle_order_engine<std::linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL>,_256UL>
                  *r)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  string res;
  string local_40;
  double local_20;
  
  lVar5 = 0x1000000;
  lVar1 = std::chrono::_V2::system_clock::now();
  dVar8 = 0.0;
  do {
    lVar2 = r->_M_y - 1;
    auVar6._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar6._0_8_ = lVar2;
    auVar6._12_4_ = 0x45300000;
    dVar7 = (((auVar6._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0)) / 2147483646.0) * 256.0
    ;
    uVar3 = (ulong)dVar7;
    uVar3 = (long)(dVar7 - 9.223372036854776e+18) & (long)uVar3 >> 0x3f | uVar3;
    r->_M_y = r->_M_v[uVar3];
    uVar4 = ((r->_M_b)._M_x * 0x41a7) % 0x7fffffff;
    (r->_M_b)._M_x = uVar4;
    r->_M_v[uVar3] = uVar4;
    dVar8 = dVar8 + (double)((int)r->_M_y + -1) * 4.656612879582606e-10;
    lVar5 = lVar5 + -1;
  } while (lVar5 != 0);
  lVar5 = std::chrono::_V2::system_clock::now();
  local_20 = 16.777216 / ((double)((lVar5 - lVar1) / 1000) * 1e-06);
  to_string<double>(&local_40,&local_20);
  while (local_40._M_string_length < 10) {
    std::__cxx11::string::push_back((char)&local_40);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,local_40._M_dataplus._M_p,local_40._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p);
  }
  return dVar8;
}

Assistant:

double time_cc(R &r) {
  double s{0};
  timer T;
  long max(1l << 24);
  for (long i{0}; i < max; ++i)
    s += trng::utility::uniformcc<double>(r);
  std::string res(to_string(1e-6 * max / T.time()));
  while (res.length() < 10)
    res += ' ';
  std::cout << res;
  return s;
}